

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_port.cc
# Opt level: O0

int raptor::JoinHostPort(UniquePtr<char> *out,char *host,int port)

{
  char *pcVar1;
  int local_2c;
  pointer pcStack_28;
  int ret;
  char *tmp;
  char *pcStack_18;
  int port_local;
  char *host_local;
  UniquePtr<char> *out_local;
  
  tmp._4_4_ = port;
  pcStack_18 = host;
  host_local = (char *)out;
  if (*host != '[') {
    pcVar1 = strchr(host,0x3a);
    if (pcVar1 != (char *)0x0) {
      local_2c = raptor_asprintf(&stack0xffffffffffffffd8,"[%s]:%d",pcStack_18,(ulong)tmp._4_4_);
      goto LAB_0011ddfd;
    }
  }
  local_2c = raptor_asprintf(&stack0xffffffffffffffd8,"%s:%d",pcStack_18,(ulong)tmp._4_4_);
LAB_0011ddfd:
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::reset
            ((unique_ptr<char,_raptor::DefaultDeleteChar> *)host_local,pcStack_28);
  return local_2c;
}

Assistant:

int JoinHostPort(UniquePtr<char>* out, const char* host, int port) {
    char* tmp;
    int ret;
    if (host[0] != '[' && strchr(host, ':') != nullptr) {
        /* IPv6 literals must be enclosed in brackets. */
        ret = raptor_asprintf(&tmp, "[%s]:%d", host, port);
    } else {
        /* Ordinary non-bracketed host:port. */
        ret = raptor_asprintf(&tmp, "%s:%d", host, port);
    }
    out->reset(tmp);
    return ret;
}